

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmetrohash64.c
# Opt level: O1

void cmetrohash64_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pauVar1 = (undefined1 (*) [16])(key + len);
  uVar4 = len + 0x52bc33fedbe4cbb5 + (ulong)seed * 0xd6d018f5;
  if (0x1f < len) {
    auVar10 = vpbroadcastq_avx512vl();
    auVar3 = vpmovzxdq_avx(ZEXT816(0xa2aa033bd6d018f5));
    auVar2 = vpmovsxdq_avx(ZEXT816(0x30bc5b2962992fc1));
    auVar12 = auVar10;
    do {
      auVar11 = vpmullq_avx512vl(auVar3,*(undefined1 (*) [16])key);
      auVar12 = vpaddq_avx(auVar11,auVar12);
      auVar11 = vpmullq_avx512vl(auVar2,*(undefined1 (*) [16])((long)key + 0x10));
      key = (uint8_t *)((long)key + 0x20);
      auVar12 = vprolq_avx512vl(auVar12,0x23);
      auVar12 = vpaddq_avx(auVar12,auVar10);
      auVar10 = vpaddq_avx(auVar11,auVar10);
      auVar10 = vprolq_avx512vl(auVar10,0x23);
      auVar10 = vpaddq_avx(auVar10,auVar12);
    } while (key <= pauVar1 + -2);
    uVar7 = vpextrq_avx(auVar10,1);
    uVar8 = auVar12._0_8_;
    uVar6 = vpextrq_avx(auVar12,1);
    uVar5 = (uVar7 + uVar8) * 0xd6d018f5 + uVar6;
    uVar9 = auVar10._0_8_ ^ (uVar5 >> 0x1e | uVar5 << 0x22) * 0xa2aa033b;
    uVar5 = (uVar9 + uVar6) * 0xa2aa033b + uVar8;
    uVar7 = (uVar5 >> 0x1e | uVar5 << 0x22) * 0xd6d018f5 ^ uVar7;
    uVar5 = (uVar9 + uVar8) * 0xd6d018f5 + uVar7;
    uVar9 = (uVar7 + uVar6) * 0xa2aa033b + uVar9;
    uVar4 = uVar4 + ((uVar5 >> 0x1e | uVar5 << 0x22) * 0xa2aa033b ^ uVar8 ^ uVar6 ^
                    (uVar9 >> 0x1e | uVar9 << 0x22) * 0xd6d018f5);
  }
  if (0xf < (long)pauVar1 - (long)key) {
    uVar7 = *(long *)*(undefined1 (*) [16])key * 0x62992fc1 + uVar4;
    uVar5 = uVar7 >> 0x1d;
    uVar6 = uVar5 | uVar7 << 0x23;
    uVar9 = *(long *)(*(undefined1 (*) [16])key + 8) * 0x62992fc1 + uVar4;
    key = (uint8_t *)((long)key + 0x10);
    uVar7 = uVar9 >> 0x1d;
    uVar8 = uVar7 | uVar9 << 0x23;
    uVar9 = uVar8 * 0x30bc5b29;
    uVar4 = uVar4 + ((uVar7 * 0x592b8b2440000000 | uVar8 * 0x9472cc564ae2c91 >> 0x22) +
                     ((uVar5 * -0x56f83a70c0000000 | uVar6 * 0x28e511fea41f163d >> 0x22) + uVar9 ^
                     uVar6 * 0x30bc5b29) ^ uVar9);
  }
  if (7 < (long)pauVar1 - (long)key) {
    uVar4 = *(long *)*(undefined1 (*) [16])key * 0x30bc5b29 + uVar4;
    key = *(undefined1 (*) [16])key + 8;
    uVar4 = (uVar4 >> 0x24 | uVar4 * 0x10000000) * 0xa2aa033b ^ uVar4;
  }
  if (3 < (long)pauVar1 - (long)key) {
    uVar4 = (ulong)*(uint *)*(undefined1 (*) [16])key * 0x30bc5b29 + uVar4;
    key = *(undefined1 (*) [16])key + 4;
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0xa2aa033b ^ uVar4;
  }
  if (1 < (long)pauVar1 - (long)key) {
    uVar4 = (ulong)*(ushort *)*(undefined1 (*) [16])key * 0x30bc5b29 + uVar4;
    key = *(undefined1 (*) [16])key + 2;
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0xa2aa033b ^ uVar4;
  }
  if (pauVar1 != (undefined1 (*) [16])key && -1 < (long)pauVar1 - (long)key) {
    uVar4 = (ulong)(byte)(*(undefined1 (*) [16])key)[0] * 0x30bc5b29 + uVar4;
    uVar4 = (uVar4 >> 0x17 | uVar4 << 0x29) * 0xa2aa033b ^ uVar4;
  }
  uVar4 = (uVar4 >> 0x1c | uVar4 << 0x24) ^ uVar4;
  uVar5 = uVar4 * 0xd6d018f5;
  *(ulong *)out = (uVar4 * -0x497f385800000000 | uVar5 >> 0x1d) ^ uVar5;
  return;
}

Assistant:

void cmetrohash64_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xD6D018F5;
    static const uint64_t k1 = 0xA2AA033B;
    static const uint64_t k2 = 0x62992FC1;
    static const uint64_t k3 = 0x30BC5B29; 

    const uint8_t * ptr = key;
    const uint8_t * const end = ptr + len;
    
    uint64_t hash = ((((uint64_t) seed) + k2) * k0) + len;
    
    if (len >= 32)
    {
        uint64_t v[4];
        v[0] = hash;
        v[1] = hash;
        v[2] = hash;
        v[3] = hash;
        
        do
        {
            v[0] += cread_u64(ptr) * k0; ptr += 8; v[0] = crotate_right(v[0],29) + v[2];
            v[1] += cread_u64(ptr) * k1; ptr += 8; v[1] = crotate_right(v[1],29) + v[3];
            v[2] += cread_u64(ptr) * k2; ptr += 8; v[2] = crotate_right(v[2],29) + v[0];
            v[3] += cread_u64(ptr) * k3; ptr += 8; v[3] = crotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= crotate_right(((v[0] + v[3]) * k0) + v[1], 30) * k1;
        v[3] ^= crotate_right(((v[1] + v[2]) * k1) + v[0], 30) * k0;
        v[0] ^= crotate_right(((v[0] + v[2]) * k0) + v[3], 30) * k1;
        v[1] ^= crotate_right(((v[1] + v[3]) * k1) + v[2], 30) * k0;
        hash += v[0] ^ v[1];
    }
    
    if ((end - ptr) >= 16)
    {
        uint64_t v0 = hash + (cread_u64(ptr) * k2); ptr += 8; v0 = crotate_right(v0,29) * k3;
        uint64_t v1 = hash + (cread_u64(ptr) * k2); ptr += 8; v1 = crotate_right(v1,29) * k3;
        v0 ^= crotate_right(v0 * k0, 34) + v1;
        v1 ^= crotate_right(v1 * k3, 34) + v0;
        hash += v1;
    }
    
    if ((end - ptr) >= 8)
    {
        hash += cread_u64(ptr) * k3; ptr += 8;
        hash ^= crotate_right(hash, 36) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        hash += cread_u32(ptr) * k3; ptr += 4;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 2)
    {
        hash += cread_u16(ptr) * k3; ptr += 2;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        hash += cread_u8 (ptr) * k3;
        hash ^= crotate_right(hash, 23) * k1;
    }
    
    hash ^= crotate_right(hash, 28);
    hash *= k0;
    hash ^= crotate_right(hash, 29);

    memcpy(out, &hash, 8);
}